

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::uniformMatrix4fv
          (ReferenceContext *this,deInt32 location,deInt32 count,deBool transpose,float *value)

{
  ShaderProgram *pSVar1;
  pointer pUVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (this->m_currentProgram == (ShaderProgramObjectContainer *)0x0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  if (location == -1) {
    return;
  }
  if (-1 < location) {
    pSVar1 = this->m_currentProgram->m_program;
    uVar6 = (ulong)(uint)location;
    pUVar2 = (pSVar1->m_uniforms).
             super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)(((long)(pSVar1->m_uniforms).
                               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x70)) {
      if (count == 0) {
        return;
      }
      if (1 < (uint)transpose) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      lVar3 = uVar6 * 0x70;
      if ((pUVar2[uVar6].type == TYPE_FLOAT_MAT4) && (count < 2)) {
        if (transpose != 0) {
          lVar3 = lVar3 + 0x24;
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
              *(float *)((long)&(((pSVar1->m_uniforms).
                                  super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                        + lVar5 * 4 + lVar3) = value[lVar5];
            }
            lVar3 = lVar3 + 0xc;
            value = value + 3;
          }
          return;
        }
        for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
          lVar5 = lVar3;
          for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 3) {
            *(float *)((long)&((pSVar1->m_uniforms).
                               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                               ._M_impl.super__Vector_impl_data._M_start)->value + lVar5) =
                 value[lVar7];
            lVar5 = lVar5 + 4;
          }
          value = value + 1;
          lVar3 = lVar3 + 0xc;
        }
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x502;
  }
  return;
}

Assistant:

void ReferenceContext::uniformMatrix4fv (deInt32 location, deInt32 count, deBool transpose, const float *value)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);

	if (count == 0)
		return;

	RC_IF_ERROR(transpose != GL_TRUE && transpose != GL_FALSE, GL_INVALID_ENUM, RC_RET_VOID);

	switch (uniforms[location].type)
	{
		case glu::TYPE_FLOAT_MAT4:
			RC_IF_ERROR(count > 1, GL_INVALID_OPERATION, RC_RET_VOID);

			if (transpose == GL_FALSE) // input is column major => transpose from column major to internal row major
				for (int row = 0; row < 4; ++row)
				for (int col = 0; col < 4; ++col)
					uniforms[location].value.m4[row*3+col] = value[col*3+row];
			else // input is row major
				for (int row = 0; row < 4; ++row)
				for (int col = 0; col < 4; ++col)
					uniforms[location].value.m4[row*3+col] = value[row*3+col];

			break;

		default:
			setError(GL_INVALID_OPERATION);
			return;
	}
}